

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O3

bool __thiscall
QGraphicsAnchorLayoutPrivate::simplifyGraphIteration
          (QGraphicsAnchorLayoutPrivate *this,Orientation orientation,bool *feasible)

{
  QGraphicsLayoutItem *pQVar1;
  uint uVar2;
  bool bVar3;
  qsizetype qVar4;
  AnchorData *pAVar5;
  AnchorVertex **ppAVar6;
  iterator iVar7;
  AnchorData *pAVar8;
  Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue> *pNVar9;
  AnchorData *pAVar10;
  SequentialAnchorData *this_00;
  SequentialAnchorData *pSVar11;
  size_t __n;
  bool bVar12;
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *this_01;
  ulong uVar13;
  AnchorData *first;
  byte bVar14;
  long in_FS_OFFSET;
  bool newFeasible;
  AnchorVertex *next;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*> *local_e0;
  AnchorData *local_d8;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> local_b0;
  QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*> local_98;
  QArrayData *local_78;
  undefined8 uStack_70;
  long local_68;
  QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue> local_60;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*> local_58;
  qsizetype local_48;
  AnchorData *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.q_ptr;
  bVar14 = 0;
  local_60.d = (Data *)0x0;
  local_68 = 0;
  local_78 = (QArrayData *)0x0;
  uStack_70 = 0;
  local_58.first = (AnchorVertex *)0x0;
  local_58.second = (AnchorVertex *)(this->graph).m_data[(long)(int)orientation + 1].m_graph.d;
  QtPrivate::
  QPodArrayOps<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>>
  ::
  emplace<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>const&>
            ((QPodArrayOps<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>>
              *)&local_78,0,&local_58);
  local_e0 = (pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*> *
             )QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
              ::end((QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
                     *)&local_78);
  local_98.size = 0;
  local_98.d = (Data *)0x0;
  local_98.ptr = (AnchorVertex **)0x0;
  if (local_68 != 0) {
    this_01 = (this->graph).m_data + (long)(int)orientation + -1;
    do {
      iVar7 = QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
              ::end((QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
                     *)&local_78);
      first = (AnchorData *)iVar7.i[-1].first;
      pAVar10 = (AnchorData *)iVar7.i[-1].second;
      local_68 = local_68 + -1;
      Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
      adjacentVertices(&local_b0,this_01,(AnchorVertex *)pAVar10);
      bVar3 = true;
      local_d8 = pAVar10;
      if (((QGraphicsLayoutItem *)(pAVar10->super_QSimplexVariable).result != pQVar1) &&
         (local_b0.d.size == 2)) {
        pAVar8 = first;
        if (local_98.size != 0) {
          pAVar8 = (AnchorData *)local_98.ptr[local_98.size + -1];
        }
        local_40 = (AnchorData *)local_b0.d.ptr[pAVar8 != (AnchorData *)local_b0.d.ptr[1]];
        pAVar8 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
                 edgeData(this_01,(AnchorVertex *)pAVar10,(AnchorVertex *)local_40);
        if ((local_60.d == (Data *)0x0) ||
           (pNVar9 = QHashPrivate::
                     Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex*,QHashDummyValue>>
                     ::findNode<QtGraphicsAnchorLayout::AnchorVertex*>
                               ((Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex*,QHashDummyValue>>
                                 *)local_60.d,(AnchorVertex **)&local_40), pAVar5 = local_40,
           pNVar9 == (Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue> *)0x0)) {
          bVar3 = true;
          if ((pAVar8->field_0x78 & 8) == 0) {
            local_58.first = (AnchorVertex *)pAVar10;
            QtPrivate::QPodArrayOps<QtGraphicsAnchorLayout::AnchorVertex*>::
            emplace<QtGraphicsAnchorLayout::AnchorVertex*&>
                      ((QPodArrayOps<QtGraphicsAnchorLayout::AnchorVertex*> *)&local_98,
                       local_98.size,&local_58.first);
            QList<QtGraphicsAnchorLayout::AnchorVertex_*>::end
                      ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)&local_98);
            bVar3 = false;
          }
        }
        else {
          bVar3 = true;
          if (first != local_40) {
            local_58.first = (AnchorVertex *)pAVar10;
            QtPrivate::QPodArrayOps<QtGraphicsAnchorLayout::AnchorVertex*>::
            emplace<QtGraphicsAnchorLayout::AnchorVertex*&>
                      ((QPodArrayOps<QtGraphicsAnchorLayout::AnchorVertex*> *)&local_98,
                       local_98.size,&local_58.first);
            QList<QtGraphicsAnchorLayout::AnchorVertex_*>::end
                      ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)&local_98);
            local_d8 = pAVar5;
          }
        }
      }
      if (local_b0.d.size != 0) {
        uVar13 = 0;
        do {
          local_40 = (AnchorData *)local_b0.d.ptr[uVar13];
          if ((local_60.d == (Data *)0x0) ||
             (pNVar9 = QHashPrivate::
                       Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex*,QHashDummyValue>>
                       ::findNode<QtGraphicsAnchorLayout::AnchorVertex*>
                                 ((Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorVertex*,QHashDummyValue>>
                                   *)local_60.d,(AnchorVertex **)&local_40),
             pNVar9 == (Node<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue> *)0x0)) {
            local_58.first = (AnchorVertex *)first;
            if (bVar3) {
              local_58.first = (AnchorVertex *)pAVar10;
            }
            local_58.second = (AnchorVertex *)local_40;
            QtPrivate::
            QPodArrayOps<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>>
            ::
            emplace<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>const&>
                      ((QPodArrayOps<std::pair<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorVertex*>>
                        *)&local_78,local_68,&local_58);
            QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
            ::end((QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
                   *)&local_78);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < (ulong)local_b0.d.size);
      }
      local_58.first = (AnchorVertex *)pAVar10;
      QHash<QtGraphicsAnchorLayout::AnchorVertex*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                ((QHash<QtGraphicsAnchorLayout::AnchorVertex*,QHashDummyValue> *)&local_60,
                 &local_58.first,(QHashDummyValue *)&local_40);
      bVar12 = false;
      if ((bVar3) && (local_98.size != 0)) {
        pAVar10 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
                  edgeData(this_01,(AnchorVertex *)first,*local_98.ptr);
        if ((pAVar10->field_0x78 & 8) != 0) {
          first = (AnchorData *)*local_98.ptr;
          if ((&(local_98.d)->super_QArrayData == (QArrayData *)0x0) ||
             (1 < ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
            QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*>::reallocateAndGrow
                      (&local_98,GrowsAtEnd,0,
                       (QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x0);
          }
          if (local_98.size == 1) {
            local_98.size = 0;
            goto LAB_005be7cd;
          }
          local_98.ptr = local_98.ptr + 1;
          local_98.size = local_98.size + -1;
        }
        pAVar10 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
                  edgeData(this_01,local_98.ptr[local_98.size + -1],(AnchorVertex *)local_d8);
        qVar4 = local_98.size;
        if ((pAVar10->field_0x78 & 8) != 0) {
          local_d8 = (AnchorData *)local_98.ptr[local_98.size + -1];
          if ((&(local_98.d)->super_QArrayData == (QArrayData *)0x0) ||
             (1 < ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
            QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*>::reallocateAndGrow
                      (&local_98,GrowsAtEnd,0,
                       (QArrayDataPointer<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x0);
          }
          ppAVar6 = local_98.ptr + qVar4;
          if ((local_98.size * 8 + qVar4 * -8 == 0 || local_98.ptr != local_98.ptr + qVar4 + -1) &&
             (__n = local_98.size * 8 + qVar4 * -8, ppAVar6 = local_98.ptr, __n != 0)) {
            memmove(local_98.ptr + qVar4 + -1,local_98.ptr + qVar4,__n);
            ppAVar6 = local_98.ptr;
          }
          local_98.ptr = ppAVar6;
          local_98.size = local_98.size + -1;
          if (local_98.size == 0) {
            bVar12 = false;
            goto LAB_005be7cd;
          }
        }
        local_58.first = (AnchorVertex *)0x0;
        local_58.second = (AnchorVertex *)0x0;
        local_48 = 0;
        QList<QtGraphicsAnchorLayout::AnchorData_*>::reserve
                  ((QList<QtGraphicsAnchorLayout::AnchorData_*> *)&local_58,local_98.size + 1);
        uVar2 = (uint)local_98.size;
        QList<QtGraphicsAnchorLayout::AnchorData_*>::reserve
                  ((QList<QtGraphicsAnchorLayout::AnchorData_*> *)&local_58,(long)(int)(uVar2 + 1));
        if (0 < (int)uVar2) {
          uVar13 = 0;
          pAVar10 = first;
          do {
            pAVar8 = (AnchorData *)local_98.ptr[uVar13];
            local_40 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>
                       ::takeEdge(this_01,(AnchorVertex *)pAVar10,(AnchorVertex *)pAVar8);
            QtPrivate::QPodArrayOps<QtGraphicsAnchorLayout::AnchorData*>::
            emplace<QtGraphicsAnchorLayout::AnchorData*&>
                      ((QPodArrayOps<QtGraphicsAnchorLayout::AnchorData*> *)&local_58,local_48,
                       &local_40);
            QList<QtGraphicsAnchorLayout::AnchorData_*>::end
                      ((QList<QtGraphicsAnchorLayout::AnchorData_*> *)&local_58);
            uVar13 = uVar13 + 1;
            pAVar10 = pAVar8;
          } while ((uVar2 & 0x7fffffff) != uVar13);
        }
        local_40 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
                   takeEdge(this_01,local_98.ptr[local_98.size + -1],(AnchorVertex *)local_d8);
        QtPrivate::QPodArrayOps<QtGraphicsAnchorLayout::AnchorData*>::
        emplace<QtGraphicsAnchorLayout::AnchorData*&>
                  ((QPodArrayOps<QtGraphicsAnchorLayout::AnchorData*> *)&local_58,local_48,&local_40
                  );
        QList<QtGraphicsAnchorLayout::AnchorData_*>::end
                  ((QList<QtGraphicsAnchorLayout::AnchorData_*> *)&local_58);
        this_00 = (SequentialAnchorData *)operator_new(0x98);
        QtGraphicsAnchorLayout::SequentialAnchorData::SequentialAnchorData
                  (this_00,(QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)&local_98,
                   (QList<QtGraphicsAnchorLayout::AnchorData_*> *)&local_58);
        (this_00->super_AnchorData).from = (AnchorVertex *)first;
        (this_00->super_AnchorData).to = (AnchorVertex *)local_d8;
        QtGraphicsAnchorLayout::SequentialAnchorData::calculateSizeHints(this_00);
        if (local_58.first != (AnchorVertex *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(local_58.first)->_vptr_AnchorVertex)->_q_value).
          super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&(local_58.first)->_vptr_AnchorVertex)->_q_value).
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&(local_58.first)->_vptr_AnchorVertex)->_q_value).
              super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_58.first,8,0x10);
          }
        }
        local_58.first = (AnchorVertex *)CONCAT71(local_58.first._1_7_,0xaa);
        pSVar11 = (SequentialAnchorData *)
                  addAnchorMaybeParallel(this,(AnchorData *)this_00,(bool *)&local_58);
        if ((char)local_58.first == '\0') {
          *feasible = false;
          bVar12 = true;
          local_e0 = (pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>
                      *)0x0;
        }
        else if (pSVar11 == this_00) {
          QList<QtGraphicsAnchorLayout::AnchorVertex_*>::clear
                    ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)&local_98);
          bVar12 = false;
        }
        else {
          local_e0 = (pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>
                      *)0x1;
          bVar12 = true;
        }
      }
LAB_005be7cd:
      if (&(local_b0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b0.d.d)->super_QArrayData,8,0x10);
        }
      }
      bVar14 = (byte)local_e0;
      if (bVar12) goto LAB_005beadb;
    } while (local_68 != 0);
    bVar14 = 0;
LAB_005beadb:
    if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d)->super_QArrayData,8,0x10);
      }
    }
  }
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78,0x10,0x10);
    }
  }
  QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QHashDummyValue>::~QHash(&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)(bVar14 & 1);
}

Assistant:

bool QGraphicsAnchorLayoutPrivate::simplifyGraphIteration(Qt::Orientation orientation,
                                                          bool *feasible)
{
    Q_Q(QGraphicsAnchorLayout);
    Graph<AnchorVertex, AnchorData> &g = graph[orientation];

    QSet<AnchorVertex *> visited;
    QStack<std::pair<AnchorVertex *, AnchorVertex *> > stack;
    stack.push(std::pair(static_cast<AnchorVertex *>(nullptr), layoutFirstVertex[orientation]));
    QList<AnchorVertex *> candidates;

    // Walk depth-first, in the stack we store start of the candidate sequence (beforeSequence)
    // and the vertex to be visited.
    while (!stack.isEmpty()) {
        std::pair<AnchorVertex *, AnchorVertex *> pair = stack.pop();
        AnchorVertex *beforeSequence = pair.first;
        AnchorVertex *v = pair.second;

        // The basic idea is to determine whether we found an end of sequence,
        // if that's the case, we stop adding vertices to the candidate list
        // and do a simplification step.
        //
        // A vertex can trigger an end of sequence if
        // (a) it is a layout vertex, we don't simplify away the layout vertices;
        // (b) it does not have exactly 2 adjacents;
        // (c) its next adjacent is already visited (a cycle in the graph).
        // (d) the next anchor is a center anchor.

        const QList<AnchorVertex *> &adjacents = g.adjacentVertices(v);
        const bool isLayoutVertex = v->m_item == q;
        AnchorVertex *afterSequence = v;
        bool endOfSequence = false;

        //
        // Identify the end cases.
        //

        // Identifies cases (a) and (b)
        endOfSequence = isLayoutVertex || adjacents.size() != 2;

        if (!endOfSequence) {
            // This is a tricky part. We peek at the next vertex to find out whether
            //
            // - we already visited the next vertex (c);
            // - the next anchor is a center (d).
            //
            // Those are needed to identify the remaining end of sequence cases. Note that unlike
            // (a) and (b), we preempt the end of sequence by looking into the next vertex.

            // Peek at the next vertex
            AnchorVertex *after;
            if (candidates.isEmpty())
                after = (beforeSequence == adjacents.last() ? adjacents.first() : adjacents.last());
            else
                after = (candidates.constLast() == adjacents.last() ? adjacents.first() : adjacents.last());

            // ### At this point we assumed that candidates will not contain 'after', this may not hold
            // when simplifying FLOATing anchors.
            Q_ASSERT(!candidates.contains(after));

            const AnchorData *data = g.edgeData(v, after);
            Q_ASSERT(data);
            const bool cycleFound = visited.contains(after);

            // Now cases (c) and (d)...
            endOfSequence = cycleFound || data->isCenterAnchor;

            if (!endOfSequence) {
                // If it's not an end of sequence, then the vertex didn't trigger neither of the
                // previously three cases, so it can be added to the candidates list.
                candidates.append(v);
            } else if (cycleFound && (beforeSequence != after)) {
                afterSequence = after;
                candidates.append(v);
            }
        }

        //
        // Add next non-visited vertices to the stack.
        //
        for (int i = 0; i < adjacents.size(); ++i) {
            AnchorVertex *next = adjacents.at(i);
            if (visited.contains(next))
                continue;

            // If current vertex is an end of sequence, and it'll reset the candidates list. So
            // the next vertices will build candidates lists with the current vertex as 'before'
            // vertex. If it's not an end of sequence, we keep the original 'before' vertex,
            // since we are keeping the candidates list.
            if (endOfSequence)
                stack.push(std::pair(v, next));
            else
                stack.push(std::pair(beforeSequence, next));
        }

        visited.insert(v);

        if (!endOfSequence || candidates.isEmpty())
            continue;

        //
        // Create a sequence for (beforeSequence, candidates, afterSequence).
        //

        // One restriction we have is to not simplify half of an anchor and let the other half
        // unsimplified. So we remove center edges before and after the sequence.
        const AnchorData *firstAnchor = g.edgeData(beforeSequence, candidates.constFirst());
        if (firstAnchor->isCenterAnchor) {
            beforeSequence = candidates.constFirst();
            candidates.remove(0);

            // If there's not candidates to be simplified, leave.
            if (candidates.isEmpty())
                continue;
        }

        const AnchorData *lastAnchor = g.edgeData(candidates.constLast(), afterSequence);
        if (lastAnchor->isCenterAnchor) {
            afterSequence = candidates.constLast();
            candidates.remove(candidates.size() - 1);

            if (candidates.isEmpty())
                continue;
        }

        //
        // Add the sequence to the graph.
        //

        AnchorData *sequence = createSequence(&g, beforeSequence, candidates, afterSequence);

        // If 'beforeSequence' and 'afterSequence' already had an anchor between them, we'll
        // create a parallel anchor between the new sequence and the old anchor.
        bool newFeasible;
        AnchorData *newAnchor = addAnchorMaybeParallel(sequence, &newFeasible);

        if (!newFeasible) {
            *feasible = false;
            return false;
        }

        // When a new parallel anchor is create in the graph, we finish the iteration and return
        // true to indicate a new iteration is needed. This happens because a parallel anchor
        // changes the number of adjacents one vertex has, possibly opening up oportunities for
        // building candidate lists (when adjacents == 2).
        if (newAnchor != sequence)
            return true;

        // If there was no parallel simplification, we'll keep walking the graph. So we clear the
        // candidates list to start again.
        candidates.clear();
    }

    return false;
}